

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printvisitor.cpp
# Opt level: O3

void __thiscall
PrintVisitor::visit(PrintVisitor *this,Expression *parent,BinaryOperatorExpression *expression)

{
  ostream *poVar1;
  undefined1 *puVar2;
  bool bVar3;
  bool bVar4;
  OperatorChar OVar5;
  Expression *pEVar6;
  BinaryOperatorExpression *local_98;
  OperatorChar local_8c;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  string local_48;
  
  local_68._8_8_ = &local_98;
  local_50 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:56:3)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:56:3)>
             ::_M_manager;
  local_98 = expression;
  local_68._M_unused._M_object = this;
  pEVar6 = BinaryOperatorExpression::leftHandSide(expression);
  bVar3 = PredicateVisitor::apply((ExpressionPredicate *)&local_68,pEVar6);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  local_70 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:60:3)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/visitors/printvisitor.cpp:60:3)>
             ::_M_manager;
  local_88._M_unused._M_object = this;
  local_88._8_8_ = &local_98;
  pEVar6 = BinaryOperatorExpression::rightHandSide(local_98);
  bVar4 = PredicateVisitor::apply((ExpressionPredicate *)&local_88,pEVar6);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream,"(",1);
    pEVar6 = BinaryOperatorExpression::leftHandSide(local_98);
    (*pEVar6->_vptr_Expression[2])(pEVar6,this,local_98);
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream,")",1);
  }
  else {
    pEVar6 = BinaryOperatorExpression::leftHandSide(local_98);
    (*pEVar6->_vptr_Expression[2])(pEVar6,this,local_98);
  }
  OVar5 = BinaryOperatorExpression::op(local_98);
  local_48._M_dataplus._M_p._0_2_ = OVar5._0_2_;
  local_48._M_dataplus._M_p._2_1_ = OVar5.mOp2;
  OperatorChar::OperatorChar(&local_8c,'^');
  bVar3 = OperatorChar::operator!=((OperatorChar *)&local_48,&local_8c);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream," ",1);
  }
  poVar1 = this->mStream;
  OVar5 = BinaryOperatorExpression::op(local_98);
  local_8c._0_2_ = OVar5._0_2_;
  local_8c.mOp2 = OVar5.mOp2;
  OperatorChar::toString_abi_cxx11_(&local_48,&local_8c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)CONCAT53(local_48._M_dataplus._M_p._3_5_,
                                     CONCAT12(local_48._M_dataplus._M_p._2_1_,
                                              local_48._M_dataplus._M_p._0_2_)),
             local_48._M_string_length);
  puVar2 = (undefined1 *)
           CONCAT53(local_48._M_dataplus._M_p._3_5_,
                    CONCAT12(local_48._M_dataplus._M_p._2_1_,local_48._M_dataplus._M_p._0_2_));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 != &local_48.field_2) {
    operator_delete(puVar2,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream," ",1);
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream,"(",1);
    pEVar6 = BinaryOperatorExpression::rightHandSide(local_98);
    (*pEVar6->_vptr_Expression[2])(pEVar6,this,local_98);
    std::__ostream_insert<char,std::char_traits<char>>(this->mStream,")",1);
  }
  else {
    pEVar6 = BinaryOperatorExpression::rightHandSide(local_98);
    (*pEVar6->_vptr_Expression[2])(pEVar6,this,local_98);
  }
  return;
}

Assistant:

void PrintVisitor::visit(Expression* parent, BinaryOperatorExpression* expression) {
	auto needLeftSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->leftHandSide());

	auto needRightSideParentheses = PredicateVisitor::apply(
		[&](Expression* innerExpression) { return needParentheses(innerExpression, expression->op()); },
		expression->rightHandSide());

	if (needLeftSideParentheses) {
		mStream << "(";
	}

	expression->leftHandSide()->accept(*this, expression);

	if (needLeftSideParentheses) {
		mStream << ")";
	}

	bool addSpaces = expression->op() != OperatorChar('^');

	if (addSpaces) {
		mStream << " ";
	}

	mStream << expression->op().toString();

	if (addSpaces) {
		mStream << " ";
	}

	if (needRightSideParentheses) {
		mStream << "(";
	}

	expression->rightHandSide()->accept(*this, expression);

	if (needRightSideParentheses) {
		mStream << ")";
	}
}